

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_compat.c
# Opt level: O3

char * old_create_router_action_spec(CMFormatList format_list,char *function)

{
  FMFieldList list;
  char **ppcVar1;
  int iVar2;
  CMFormatList pCVar3;
  FMStructDescList format_list_00;
  char *pcVar4;
  uint uVar5;
  long lVar6;
  ulong uVar7;
  
  if (format_list == (CMFormatList)0x0) {
    uVar5 = 0;
  }
  else {
    uVar5 = 0xffffffff;
    pCVar3 = format_list;
    do {
      uVar5 = uVar5 + 1;
      ppcVar1 = &pCVar3->format_name;
      pCVar3 = pCVar3 + 1;
    } while (*ppcVar1 != (char *)0x0);
  }
  uVar7 = (ulong)uVar5;
  pcVar4 = function;
  format_list_00 = (FMStructDescList)INT_CMmalloc(uVar7 * 0x20 + 0x20);
  if (uVar5 == 0) {
    uVar7 = 0;
  }
  else {
    lVar6 = 0;
    do {
      *(undefined8 *)((long)&format_list_00->format_name + lVar6 * 2) =
           *(undefined8 *)((long)&format_list->format_name + lVar6);
      list = *(FMFieldList *)((long)&format_list->field_list + lVar6);
      *(FMFieldList *)((long)&format_list_00->field_list + lVar6 * 2) = list;
      iVar2 = struct_size_field_list(list,(int)pcVar4);
      *(int *)((long)&format_list_00->struct_size + lVar6 * 2) = iVar2;
      *(undefined8 *)((long)&format_list_00->opt_info + lVar6 * 2) = 0;
      lVar6 = lVar6 + 0x10;
    } while (uVar7 << 4 != lVar6);
  }
  format_list_00[uVar7].format_name = (char *)0x0;
  format_list_00[uVar7].field_list = (FMFieldList)0x0;
  pcVar4 = create_router_action_spec(format_list_00,function);
  return pcVar4;
}

Assistant:

extern char *
old_create_router_action_spec(CMFormatList format_list, char *function)
{
    FMStructDescList structs;
    int count = 0, i;
    while (format_list && (format_list[count].format_name != NULL)) count++;
    structs = malloc(sizeof(structs[0]) * (count + 1));
    for (i = 0; i < count; i++) {
	structs[i].format_name = format_list[i].format_name;
	structs[i].field_list = format_list[i].field_list;
	structs[i].struct_size = struct_size_field_list(structs[i].field_list, (int)sizeof(char*));
	structs[i].opt_info = NULL;
    }
    structs[count].format_name = NULL;
    structs[count].field_list = NULL;
    return create_router_action_spec(structs, function);
}